

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O3

REF_STATUS ref_search_insert(REF_SEARCH ref_search,REF_INT item,REF_DBL *position,REF_DBL radius)

{
  int child;
  int iVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  undefined8 uVar4;
  REF_STATUS RVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  
  child = ref_search->empty;
  if (child < ref_search->n) {
    if (-1 < item) {
      ref_search->empty = child + 1;
      ref_search->item[child] = item;
      iVar1 = ref_search->d;
      if (0 < (long)iVar1) {
        pRVar2 = ref_search->pos;
        lVar6 = 0;
        do {
          pRVar2[iVar1 * child + lVar6] = position[lVar6];
          lVar6 = lVar6 + 1;
        } while (iVar1 != lVar6);
      }
      ref_search->radius[child] = radius;
      uVar3 = ref_search_home(ref_search,child,0);
      if (uVar3 == 0) {
        return 0;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x88
             ,"ref_search_insert",(ulong)uVar3,"top level home");
      return 1;
    }
    pcVar8 = "item can not be negative";
    RVar5 = 3;
    uVar4 = 0x7e;
    uVar7 = 3;
  }
  else {
    pcVar8 = "need larger tree for more items";
    RVar5 = 7;
    uVar4 = 0x7c;
    uVar7 = 7;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",uVar4,
         "ref_search_insert",uVar7,pcVar8);
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_search_insert(REF_SEARCH ref_search, REF_INT item,
                                     REF_DBL *position, REF_DBL radius) {
  REF_INT i, location;
  if (ref_search->empty >= ref_search->n)
    RSS(REF_INCREASE_LIMIT, "need larger tree for more items");

  if (item < 0) RSS(REF_INVALID, "item can not be negative");

  location = ref_search->empty;
  (ref_search->empty)++;

  ref_search->item[location] = item;
  for (i = 0; i < ref_search->d; i++)
    ref_search->pos[i + ref_search->d * location] = position[i];
  ref_search->radius[location] = radius;

  RSS(ref_search_home(ref_search, location, 0), "top level home");

  return REF_SUCCESS;
}